

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void do_init_context(sexp_conflict *ctx,sexp_conflict *env,sexp_uint_t heap_size,
                    sexp_uint_t heap_max_size,sexp_sint_t fold_case)

{
  sexp_conflict psVar1;
  undefined8 uVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  int *piStack_90;
  int *piStack_88;
  undefined8 uStack_80;
  int *piStack_78;
  int **ppiStack_70;
  undefined8 uStack_68;
  int **ppiStack_60;
  undefined8 **ppuStack_58;
  undefined8 *puStack_50;
  undefined1 **ppuStack_48;
  undefined1 *puStack_40;
  int ***pppiStack_38;
  sexp_conflict *ppsStack_30;
  sexp_conflict *ppsStack_28;
  code *pcStack_20;
  
  lVar5 = 0;
  piVar4 = (int *)0x0;
  pcStack_20 = (code *)0x104cab;
  psVar1 = (sexp_conflict)sexp_make_eval_context(0,0,0,heap_size,heap_max_size);
  *ctx = psVar1;
  if (psVar1 != (sexp_conflict)0x0) {
    (((psVar1->value).type.setters)->value).context.mark_stack[6].prev =
         (sexp_mark_stack_ptr_t *)((ulong)(fold_case != 0) << 8 | 0x3e);
    *env = ((*ctx)->value).type.cpl;
    return;
  }
  pcStack_20 = check_exception;
  do_init_context_cold_1();
  puStack_40 = (undefined1 *)&piStack_90;
  piStack_88 = (int *)0x43e;
  piStack_90 = (int *)0x43e;
  uStack_80 = 0x43e;
  if ((((ulong)piVar4 & 3) == 0 && piVar4 != (int *)0x0) && (*piVar4 == 0x13)) {
    ppiStack_70 = &piStack_88;
    pppiStack_38 = &ppiStack_70;
    uStack_68 = *(undefined8 *)(lVar5 + 0x6080);
    ppuStack_48 = &puStack_40;
    puStack_50 = &uStack_80;
    ppuStack_58 = &puStack_50;
    ppiStack_60 = &piStack_78;
    *(int ****)(lVar5 + 0x6080) = &ppiStack_60;
    piStack_78 = piVar4;
    ppsStack_30 = env;
    ppsStack_28 = ctx;
    pcStack_20 = (code *)fold_case;
    uVar2 = sexp_env_ref();
    piStack_88 = (int *)sexp_parameter_ref(lVar5,uVar2);
    if ((((ulong)piStack_88 & 3) != 0) || (*piStack_88 != 0x11)) {
      piStack_88 = (int *)sexp_make_output_port(lVar5,_stderr,0x3e);
    }
    sexp_print_exception_op(lVar5,0,2,piVar4,piStack_88);
    sexp_print_exception_stack_trace_op(lVar5,0,2,piVar4,piStack_88);
    piVar3 = *(int **)(*(long *)(lVar5 + 0x28) + 0x68);
    if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x17)) {
      piStack_90 = (int *)sexp_eval_string(lVar5,"(load-module \'(chibi repl))",0xffffffffffffffff);
      if ((((ulong)piStack_90 & 3) == 0) && (*piStack_90 == 10)) {
        piStack_90 = *(int **)(piStack_90 + 6);
        if ((((ulong)piStack_90 & 3) == 0) && (*piStack_90 == 0x17)) {
          uStack_80 = sexp_intern(lVar5,"repl-advise-exception",0xffffffffffffffff);
          piVar3 = (int *)sexp_env_ref(lVar5,piStack_90,uStack_80,0x3e);
          piStack_90 = piVar3;
          if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x14)) {
            piStack_78 = (int *)sexp_list2(lVar5,piVar4,piStack_88);
            sexp_apply(lVar5,piVar3,piStack_78);
          }
        }
      }
    }
    *(undefined8 *)(lVar5 + 0x6080) = uStack_68;
    exit(0x46);
  }
  return;
}

Assistant:

static void do_init_context (sexp* ctx, sexp* env, sexp_uint_t heap_size,
                             sexp_uint_t heap_max_size, sexp_sint_t fold_case) {
  *ctx = sexp_make_eval_context(NULL, NULL, NULL, heap_size, heap_max_size);
  if (! *ctx) {
    fprintf(stderr, "chibi-scheme: out of memory\n");
    exit_failure();
  }
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_global(*ctx, SEXP_G_FOLD_CASE_P) = sexp_make_boolean(fold_case);
#endif
  *env = sexp_context_env(*ctx);
}